

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

uint32_t trb_max_gap_to_type(trt_parent_cache ca,trt_printer_ctx *pc,trt_tree_ctx *tc)

{
  ly_bool lVar1;
  uint32_t local_1b4;
  trt_node local_1b0;
  trt_node local_150;
  trt_node local_f0;
  uint32_t local_90;
  uint32_t local_8c;
  int32_t len;
  int32_t maxlen;
  trt_node node;
  trt_tree_ctx *tc_local;
  trt_printer_ctx *pc_local;
  trt_parent_cache ca_local;
  
  local_8c = 0;
  node._88_8_ = tc;
  (*(pc->fp).modify.first_sibling)(&local_f0,ca,tc);
  memcpy(&len,&local_f0,0x60);
  while (lVar1 = trp_node_is_empty((trt_node *)&len), lVar1 == '\0') {
    local_90 = trb_gap_to_type((trt_node *)&len);
    local_1b4 = local_90;
    if ((int)local_90 <= (int)local_8c) {
      local_1b4 = local_8c;
    }
    local_8c = local_1b4;
    (*(pc->fp).modify.next_sibling)(&local_150,ca,(trt_tree_ctx *)node._88_8_);
    memcpy(&len,&local_150,0x60);
  }
  (*(pc->fp).modify.first_sibling)(&local_1b0,ca,(trt_tree_ctx *)node._88_8_);
  return local_8c;
}

Assistant:

static uint32_t
trb_max_gap_to_type(struct trt_parent_cache ca, struct trt_printer_ctx *pc, struct trt_tree_ctx *tc)
{
    struct trt_node node;
    int32_t maxlen, len;

    maxlen = 0;
    for (node = pc->fp.modify.first_sibling(ca, tc);
            !trp_node_is_empty(&node);
            node = pc->fp.modify.next_sibling(ca, tc)) {
        len = trb_gap_to_type(&node);
        maxlen = maxlen < len ? len : maxlen;
    }
    pc->fp.modify.first_sibling(ca, tc);

    return maxlen;
}